

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowVersionManager::GetCommittedSelVector
          (RowVersionManager *this,transaction_t start_time,transaction_t transaction_id,
          idx_t vector_idx,SelectionVector *sel_vector,idx_t max_count)

{
  int iVar1;
  ChunkInfo *pCVar2;
  undefined4 extraout_var;
  optional_ptr<duckdb::ChunkInfo,_true> info;
  optional_ptr<duckdb::ChunkInfo,_true> local_38;
  
  ::std::mutex::lock(&this->version_lock);
  local_38 = GetChunkInfo(this,vector_idx);
  if (local_38.ptr != (ChunkInfo *)0x0) {
    pCVar2 = optional_ptr<duckdb::ChunkInfo,_true>::operator->(&local_38);
    iVar1 = (*pCVar2->_vptr_ChunkInfo[3])(pCVar2,start_time,transaction_id,sel_vector,max_count);
    max_count = CONCAT44(extraout_var,iVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return max_count;
}

Assistant:

idx_t RowVersionManager::GetCommittedSelVector(transaction_t start_time, transaction_t transaction_id, idx_t vector_idx,
                                               SelectionVector &sel_vector, idx_t max_count) {
	lock_guard<mutex> l(version_lock);
	auto info = GetChunkInfo(vector_idx);
	if (!info) {
		return max_count;
	}
	return info->GetCommittedSelVector(start_time, transaction_id, sel_vector, max_count);
}